

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncloseWorld.cpp
# Opt level: O0

Pass * wasm::createEncloseWorldPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x58);
  memset(this,0,0x58);
  anon_unknown_161::EncloseWorld::EncloseWorld((EncloseWorld *)this);
  return this;
}

Assistant:

Pass* createEncloseWorldPass() { return new EncloseWorld(); }